

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

base_learner * log_multi_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  parser *ppVar2;
  vw *all_00;
  int iVar3;
  log_multi *d;
  option_group_definition *poVar4;
  typed_option<unsigned_int> *ptVar5;
  loss_function *plVar6;
  base_learner *l;
  single_learner *base;
  learner<log_multi,_example> *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  byte bVar11;
  size_type __dnew_4;
  option_group_definition new_options;
  string loss_function;
  size_type __dnew_1;
  size_type __dnew_3;
  size_type __dnew_2;
  _func_int ***local_6c0;
  _func_int **local_6b8;
  _func_int **local_6b0 [2];
  bool *local_6a0;
  vw *local_698;
  long local_690;
  _func_int ***local_688;
  _func_int **local_680;
  _func_int **local_678 [2];
  _func_int ***local_668;
  _func_int **local_660;
  _func_int **local_658 [2];
  _func_int ***local_648;
  _func_int **local_640;
  _func_int **local_638 [2];
  string local_628;
  string local_608;
  string local_5e8;
  option_group_definition local_5c8;
  string local_590;
  long *local_570;
  long local_568;
  long local_560 [2];
  undefined1 local_550 [112];
  bool local_4e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b8;
  string local_4b0;
  undefined1 local_490 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  typed_option<unsigned_int> local_3f0;
  typed_option<unsigned_int> local_350;
  typed_option<unsigned_int> local_2b0;
  typed_option<unsigned_int> local_210;
  typed_option<bool> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar11 = 0;
  local_698 = all;
  d = calloc_or_throw<log_multi>(1);
  *(undefined8 *)d = 0;
  (d->nodes)._begin = (node *)0x0;
  (d->nodes)._end = (node *)0x0;
  (d->nodes).end_array = (node *)0x0;
  (d->nodes).erase_count = 0;
  d->max_predictors = 0;
  d->predictors_used = 0;
  d->progress = false;
  *(undefined3 *)&d->field_0x39 = 0;
  d->swap_resist = 0;
  *(undefined8 *)&d->nbofswaps = 0;
  local_550._0_8_ = (_func_int **)0x20;
  local_6c0 = local_6b0;
  local_6c0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)local_550);
  local_6b0[0] = (_func_int **)local_550._0_8_;
  local_6c0[2] = (_func_int **)0x6c6369746c754d20;
  local_6c0[3] = (_func_int **)0x6565725420737361;
  *(undefined4 *)local_6c0 = 0x61676f4c;
  builtin_strncpy((char *)((long)local_6c0 + 4),"rith",4);
  *(undefined4 *)(local_6c0 + 1) = 0x2063696d;
  builtin_strncpy((char *)((long)local_6c0 + 0xc),"Time",4);
  local_6b8 = (_func_int **)local_550._0_8_;
  *(char *)((long)local_6c0 + local_550._0_8_) = '\0';
  local_5c8.m_name._M_dataplus._M_p = (pointer)&local_5c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c8,local_6c0,(char *)(local_550._0_8_ + (long)local_6c0));
  local_5c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6c0 != local_6b0) {
    operator_delete(local_6c0);
  }
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  local_5e8.field_2._M_allocated_capacity = 0x746c756d5f676f6c;
  local_5e8.field_2._8_2_ = 0x69;
  local_5e8._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_550,&local_5e8,&d->k);
  local_4e0 = true;
  local_648 = local_638;
  local_490._0_8_ = (_func_int **)0x1e;
  local_648 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_648,(ulong)local_490);
  local_638[0] = (_func_int **)local_490._0_8_;
  builtin_strncpy((char *)((long)local_648 + 0xe),"e for mu",8);
  builtin_strncpy((char *)((long)local_648 + 0x16),"lticlass",8);
  *local_648 = (_func_int **)0x696c6e6f20657355;
  local_648[1] = (_func_int **)0x206565727420656e;
  local_640 = (_func_int **)local_490._0_8_;
  *(char *)((long)local_648 + local_490._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_550 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_d0,(typed_option<unsigned_int> *)local_550);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(&local_5c8,&local_d0);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_608.field_2._M_allocated_capacity._0_7_ = 0x676f72705f6f6e;
  local_608.field_2._7_4_ = 0x73736572;
  local_608._M_string_length = 0xb;
  local_608.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_608,&d->progress);
  local_668 = local_658;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_668 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)&local_350);
  local_658[0] = local_350.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_668 + 0xe),"ssive va",8);
  builtin_strncpy((char *)((long)local_668 + 0x16),"lidation",8);
  *local_668 = (_func_int **)0x20656c6261736964;
  local_668[1] = (_func_int **)0x73736572676f7270;
  local_660 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_668 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_490);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_170);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  local_628.field_2._M_allocated_capacity._0_7_ = 0x65725f70617773;
  local_628.field_2._M_local_buf[7] = 's';
  local_628.field_2._8_7_ = 0x65636e61747369;
  local_628._M_string_length = 0xf;
  local_628.field_2._M_local_buf[0xf] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_350,&local_628,&d->swap_resist);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_350,4);
  local_688 = local_678;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_688 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_688,(ulong)&local_3f0);
  local_678[0] = local_3f0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_688 + 0xe),"ssive va",8);
  builtin_strncpy((char *)((long)local_688 + 0x16),"lidation",8);
  *local_688 = (_func_int **)0x20656c6261736964;
  local_688[1] = (_func_int **)0x73736572676f7270;
  local_680 = local_3f0.super_base_option._vptr_base_option;
  *(char *)((long)local_688 + (long)local_3f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_210,ptVar5);
  local_6a0 = &d->progress;
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(poVar4,&local_210);
  local_4b0.field_2._M_allocated_capacity._0_7_ = 0x65725f70617773;
  local_4b0.field_2._M_local_buf[7] = 's';
  local_4b0.field_2._8_7_ = 0x65636e61747369;
  local_4b0._M_string_length = 0xf;
  local_4b0.field_2._M_local_buf[0xf] = '\0';
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  VW::config::typed_option<unsigned_int>::typed_option(&local_3f0,&local_4b0,&d->swap_resist);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_3f0,4);
  local_690 = 0x2b;
  local_570 = local_560;
  local_570 = (long *)std::__cxx11::string::_M_create((ulong *)&local_570,(ulong)&local_690);
  local_560[0] = local_690;
  builtin_strncpy((char *)((long)local_570 + 0x1b)," swap, d",8);
  builtin_strncpy((char *)((long)local_570 + 0x23),"efault=4",8);
  local_570[2] = 0x65636e6174736973;
  local_570[3] = 0x70617773206f7420;
  *local_570 = 0x3d20726568676968;
  local_570[1] = 0x65722065726f6d20;
  local_568 = local_690;
  *(char *)((long)local_570 + local_690) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_int>::typed_option(&local_2b0,ptVar5);
  VW::config::option_group_definition::add<unsigned_int>(poVar4,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_570 != local_560) {
    operator_delete(local_570);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_3f0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_210.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_688 != local_678) {
    operator_delete(local_688);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_350.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce110;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_668 != local_658) {
    operator_delete(local_668);
  }
  local_490._0_8_ = &PTR__typed_option_002ce110;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002ce180;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  local_550._0_8_ = &PTR__typed_option_002ce180;
  if (local_4b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4b8._M_pi);
  }
  all_00 = local_698;
  if (local_4c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_550);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_5c8);
  pp_Var1 = (_func_int **)(local_550 + 0x10);
  local_550._16_8_ = 0x746c756d5f676f6c;
  local_550._24_2_ = 0x69;
  local_550._8_8_ = (pointer)0x9;
  local_550._0_8_ = pp_Var1;
  iVar3 = (*options->_vptr_options_i[1])(options,local_550);
  if ((_func_int **)local_550._0_8_ != pp_Var1) {
    operator_delete((void *)local_550._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar7 = (learner<log_multi,_example> *)0x0;
  }
  else {
    *local_6a0 = (bool)(*local_6a0 ^ 1);
    local_550._16_8_ = 0x656c69746e617571;
    local_550._8_8_ = (pointer)0x8;
    local_550._24_2_ = local_550._24_2_ & 0xff00;
    local_550._0_8_ = pp_Var1;
    if (all_00->loss != (loss_function *)0x0) {
      (*all_00->loss->_vptr_loss_function[9])();
    }
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_590,local_550._0_8_,(pointer)(local_550._8_8_ + local_550._0_8_));
    plVar6 = getLossFunction(all_00,&local_590,0.5);
    all_00->loss = plVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
    d->max_predictors = (ulong)(d->k - 1);
    init_tree(d);
    l = setup_base(options,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    ppVar2 = all_00->p;
    plVar7 = LEARNER::learner<log_multi,example>::init_learner<LEARNER::learner<char,example>>
                       (d,base,learn,predict,d->max_predictors,multiclass);
    *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x68) = MULTICLASS::finish_example<log_multi>;
    ppuVar9 = &MULTICLASS::mc_label;
    plVar10 = &ppVar2->lp;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    *(code **)(plVar7 + 0x80) = save_load_tree;
    *(undefined8 *)(plVar7 + 0x70) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0x78) = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    if ((_func_int **)local_550._0_8_ != pp_Var1) {
      operator_delete((void *)local_550._0_8_);
    }
    d = (log_multi *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8.m_name._M_dataplus._M_p != &local_5c8.m_name.field_2) {
    operator_delete(local_5c8.m_name._M_dataplus._M_p);
  }
  if (d != (log_multi *)0x0) {
    free(d);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* log_multi_setup(options_i& options, vw& all)  // learner setup
{
  auto data = scoped_calloc_or_throw<log_multi>();
  option_group_definition new_options("Logarithmic Time Multiclass Tree");
  new_options.add(make_option("log_multi", data->k).keep().help("Use online tree for multiclass"))
      .add(make_option("no_progress", data->progress).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist).default_value(4).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist)
               .default_value(4)
               .help("higher = more resistance to swap, default=4"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("log_multi"))
    return nullptr;

  data->progress = !data->progress;

  string loss_function = "quantile";
  float loss_parameter = 0.5;
  delete (all.loss);
  all.loss = getLossFunction(all, loss_function, loss_parameter);

  data->max_predictors = data->k - 1;
  init_tree(*data.get());

  learner<log_multi, example>& l = init_multiclass_learner(
      data, as_singleline(setup_base(options, all)), learn, predict, all.p, data->max_predictors);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}